

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Accuracy::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  TestLog *this_00;
  MessageBuilder *this_01;
  TextureCube *this_02;
  TextureCube *pTVar4;
  PixelBufferAccess *access;
  RGBA local_1d0;
  Vec4 local_1cc;
  uint local_1bc;
  uint local_1b8;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int faceNdx;
  int numLevels;
  MessageBuilder local_190;
  TextureCubeMipmapCase *local_10;
  TextureCubeMipmapCase *this_local;
  
  local_10 = this;
  uVar1 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((uVar1 & 1) == 0) {
    this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_190,
                         (char (*) [59])"Warning: High precision not supported in fragment shaders."
                        );
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  this_02 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_02,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_02;
  iVar2 = ::deLog2Floor32(this->m_size);
  dVar3 = iVar2 + 1;
  step = 0;
  levelNdx = dVar3;
  while ((int)step < 6) {
    for (inc = 0; (int)inc < levelNdx; inc = inc + 1) {
      dec = (deUint32)(0xff / (long)(levelNdx + -1));
      rgb = ::deClamp32(dec * inc,0,0xff);
      color = 0xff - rgb;
      local_1b8 = 0;
      switch(step) {
      case 0:
        local_1b8 = rgb << 0x10 | color * 0x100 | 0xff;
        break;
      case 1:
        local_1b8 = rgb << 8 | 0xff0000 | color;
        break;
      case 2:
        local_1b8 = color * 0x10000 | 0xff00 | rgb;
        break;
      case 3:
        local_1b8 = color * 0x10000 | rgb << 8 | 0xff;
        break;
      case 4:
        local_1b8 = color * 0x100 | 0xff0000 | rgb;
        break;
      case 5:
        local_1b8 = rgb << 0x10 | 0xff00 | color;
      }
      local_1bc = local_1b8 | 0xff000000;
      pTVar4 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::allocLevel(pTVar4,step,inc);
      pTVar4 = glu::TextureCube::getRefTexture(this->m_texture);
      access = tcu::TextureCube::getLevelFace(pTVar4,inc,step);
      tcu::RGBA::RGBA(&local_1d0,local_1bc);
      tcu::RGBA::toVec((RGBA *)&local_1cc);
      tcu::clear(access,&local_1cc);
    }
    dVar3 = step + 1;
    step = dVar3;
  }
  return dVar3;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}